

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetHomeDirectory(cmake *this,string *dir)

{
  bool bVar1;
  ProjectKind PVar2;
  pointer pcVar3;
  pointer pcVar4;
  string *__t;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string_view local_60;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *dir_local;
  cmake *this_local;
  
  local_18 = dir;
  dir_local = (string *)this;
  pcVar3 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  cmState::SetSourceDirectory(pcVar3,local_18);
  bVar1 = cmStateSnapshot::IsValid(&this->CurrentSnapshot);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CMAKE_SOURCE_DIR",&local_39);
    local_60 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_18);
    cmStateSnapshot::SetDefinition(&this->CurrentSnapshot,&local_38,local_60);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  pcVar3 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  PVar2 = cmState::GetProjectKind(pcVar3);
  if (PVar2 == Normal) {
    pcVar4 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                       (&this->Messenger);
    __t = GetHomeDirectory_abi_cxx11_(this);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_88,__t);
    cmMessenger::SetTopSource(pcVar4,&local_88);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_88);
  }
  else {
    pcVar4 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                       (&this->Messenger);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    cmMessenger::SetTopSource(pcVar4,&local_b0);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_b0);
  }
  return;
}

Assistant:

void cmake::SetHomeDirectory(const std::string& dir)
{
  this->State->SetSourceDirectory(dir);
  if (this->CurrentSnapshot.IsValid()) {
    this->CurrentSnapshot.SetDefinition("CMAKE_SOURCE_DIR", dir);
  }

  if (this->State->GetProjectKind() == cmState::ProjectKind::Normal) {
    this->Messenger->SetTopSource(this->GetHomeDirectory());
  } else {
    this->Messenger->SetTopSource(cm::nullopt);
  }
}